

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O0

void pnga_print_file(FILE *file,Integer g_a)

{
  Integer pretty;
  Integer lo [7];
  Integer dims [7];
  Integer ndim;
  Integer type;
  Integer i;
  Integer *in_stack_00000158;
  Integer *in_stack_00000160;
  Integer *in_stack_00000168;
  Integer in_stack_00000170;
  Integer in_stack_00000ab0;
  Integer *in_stack_00000ab8;
  Integer *in_stack_00000ac0;
  Integer in_stack_00000ac8;
  FILE *in_stack_00000ad0;
  undefined8 local_a8 [16];
  long local_28;
  long local_18;
  
  pnga_inquire(in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158);
  for (local_18 = 0; local_18 < local_28; local_18 = local_18 + 1) {
    local_a8[local_18] = 1;
  }
  pnga_print_patch_file
            (in_stack_00000ad0,in_stack_00000ac8,in_stack_00000ac0,in_stack_00000ab8,
             in_stack_00000ab0);
  return;
}

Assistant:

void pnga_print_file(FILE *file, Integer g_a)
{
    Integer i;
    Integer type, ndim, dims[MAXDIM];
    Integer lo[MAXDIM];
    Integer pretty = 1;

    pnga_inquire(g_a, &type, &ndim, dims);

    for(i=0; i<ndim; i++) lo[i] = 1;

    pnga_print_patch_file(file, g_a, lo, dims, pretty);
}